

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.h
# Opt level: O2

void __thiscall libwebm::PesOptionalHeader::PesOptionalHeader(PesOptionalHeader *this)

{
  (this->marker).bits = 2;
  (this->marker).num_bits = 2;
  (this->marker).index = '\0';
  (this->marker).shift = 6;
  (this->scrambling).bits = 0;
  (this->scrambling).num_bits = 2;
  (this->scrambling).index = '\0';
  (this->scrambling).shift = 4;
  (this->priority).bits = 0;
  (this->priority).num_bits = 1;
  (this->priority).index = '\0';
  (this->priority).shift = 3;
  (this->data_alignment).bits = 0;
  (this->data_alignment).num_bits = 1;
  (this->data_alignment).index = '\0';
  (this->data_alignment).shift = 2;
  (this->copyright).bits = 0;
  (this->copyright).num_bits = 1;
  (this->copyright).index = '\0';
  (this->copyright).shift = 1;
  (this->original).bits = 0;
  (this->original).num_bits = 1;
  (this->original).index = '\0';
  (this->original).shift = 0;
  (this->has_pts).bits = 1;
  (this->has_pts).num_bits = 1;
  (this->has_pts).index = '\x01';
  (this->has_pts).shift = 7;
  (this->has_dts).bits = 0;
  (this->has_dts).num_bits = 1;
  (this->has_dts).index = '\x01';
  (this->has_dts).shift = 6;
  (this->unused).bits = 0;
  (this->unused).num_bits = 6;
  (this->unused).index = '\x01';
  (this->unused).shift = 0;
  (this->remaining_size).bits = 6;
  (this->remaining_size).num_bits = 8;
  (this->remaining_size).index = '\x02';
  (this->remaining_size).shift = 0;
  (this->pts).bits = 0;
  (this->pts).num_bits = 0x28;
  (this->pts).index = '\x03';
  (this->pts).shift = 0;
  (this->stuffing_byte).bits = 0xff;
  (this->stuffing_byte).num_bits = 8;
  (this->stuffing_byte).index = '\b';
  (this->stuffing_byte).shift = 0;
  this->fragment = false;
  return;
}

Assistant:

PesHeaderField(std::uint64_t value, std::uint32_t size_in_bits,
                 std::uint8_t byte_index, std::uint8_t bits_to_shift)
      : bits(value),
        num_bits(size_in_bits),
        index(byte_index),
        shift(bits_to_shift) {}